

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O1

uint cubicSolver(double *ce,double *roots)

{
  double dVar1;
  undefined1 auVar2 [8];
  ostream *poVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Db;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  complex<double> __r;
  complex<double> w;
  undefined8 local_a8;
  undefined4 local_98;
  double local_80;
  undefined1 local_68 [8];
  double dStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  double local_40;
  double local_38;
  double dStack_30;
  
  dVar7 = *ce;
  dVar6 = dVar7 * 0.3333333333333333;
  dVar8 = ce[1] - dVar6 * dVar7;
  dVar7 = (dVar7 * 0.07407407407407407 * dVar7 + ce[1] * -0.3333333333333333) * dVar7 + ce[2];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cubicSolver:: p=",0x10);
  poVar3 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tq=",3);
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (1e-75 <= ABS(dVar8)) {
    local_80 = dVar7 * 0.25;
    dVar9 = dVar8 * 0.037037037037037035 * dVar8 * dVar8 + dVar7 * local_80;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cubicSolver:: discriminant=",0x1b);
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (dVar9 <= 0.0) {
      dStack_30 = 0.0;
      dStack_60 = 0.0;
      local_68 = (undefined1  [8])local_80;
      local_38 = dVar7;
      std::complex<double>::operator*=((complex<double> *)local_68,(complex<double> *)&local_38);
      dVar9 = csqrt((dVar8 * dVar8 * dVar8) / 27.0 + (double)local_68);
      local_68 = (undefined1  [8])(dVar7 * -0.5 - dVar9);
      dVar7 = -dStack_60;
      local_48 = (undefined1  [8])0x3fd5555555555555;
      dStack_60 = dVar7;
      std::pow<double>((complex<double> *)local_68,(double *)local_48);
      local_38 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_98 = SUB84(dVar8,0);
      dStack_30 = dVar7;
      dVar7 = (double)__divdc3(local_98,0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) * 3.0,
                               dVar7 * 3.0);
      dVar7 = local_38 - dVar7;
      local_48 = (undefined1  [8])0xbfe0000000000000;
      local_40 = 0.8660254037844386;
      local_68 = (undefined1  [8])local_38;
      dStack_60 = dStack_30;
      std::complex<double>::operator*=((complex<double> *)local_68,(complex<double> *)local_48);
      auVar2 = local_68;
      local_68 = (undefined1  [8])(local_38 * 3.0);
      dStack_60 = dStack_30 * 3.0;
      std::complex<double>::operator*=((complex<double> *)local_68,(complex<double> *)local_48);
      dVar9 = (double)__divdc3(local_98,0,local_68,dStack_60);
      dVar1 = (double)__divdc3(SUB84(local_38,0),dStack_30,local_48,local_40);
      dVar8 = (double)__divdc3(SUB84((double)local_48 * dVar8,0),dVar8 * local_40,local_38 * 3.0,
                               dStack_30 * 3.0);
      *roots = dVar7 - dVar6;
      roots[1] = ((double)auVar2 - dVar9) - dVar6;
      roots[2] = (dVar1 - dVar8) - dVar6;
      return 3;
    }
    if (0.0 <= dVar9) {
      if (dVar9 < 0.0) {
        local_80 = sqrt(dVar9);
      }
      else {
        local_80 = SQRT(dVar9);
      }
      local_80 = dVar7 * -0.5 + local_80;
      local_58._8_4_ = 0;
      local_58._0_8_ = -dVar7 - local_80;
      local_58._12_4_ = 0x80000000;
    }
    if (dVar9 < 0.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"cubicSolver::Error cubicSolver(",0x1f);
      poVar3 = std::ostream::_M_insert<double>(*ce);
      local_68[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_68,1);
      poVar3 = std::ostream::_M_insert<double>(ce[1]);
      local_68[0] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_68,1);
      poVar3 = std::ostream::_M_insert<double>(ce[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    }
    if (dVar7 <= 0.0) {
      dVar7 = pow(local_80,0.3333333333333333);
      uVar4 = SUB84(dVar7,0);
      uVar5 = (uint)((ulong)dVar7 >> 0x20);
    }
    else {
      dVar7 = pow(-(double)local_58._0_8_,0.3333333333333333);
      uVar5 = (uint)((ulong)dVar7 >> 0x20) ^ 0x80000000;
      uVar4 = SUB84(dVar7,0);
    }
    local_a8 = (double)CONCAT44(uVar5,uVar4);
    dVar7 = (dVar8 * -0.3333333333333333) / (double)CONCAT44(uVar5,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cubicSolver:: u=",0x10);
    poVar3 = std::ostream::_M_insert<double>(local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tv=",3);
    poVar3 = std::ostream::_M_insert<double>(dVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cubicSolver:: u^3=",0x12);
    poVar3 = std::ostream::_M_insert<double>(local_a8 * local_a8 * local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tv^3=",5);
    poVar3 = std::ostream::_M_insert<double>(dVar7 * dVar7 * dVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    dVar7 = dVar7 + local_a8;
  }
  else if (dVar7 <= 0.0) {
    dVar7 = pow(-dVar7,0.3333333333333333);
  }
  else {
    dVar7 = pow(dVar7,0.3333333333333333);
    dVar7 = -dVar7;
  }
  *roots = dVar7 - dVar6;
  return 1;
}

Assistant:

unsigned int cubicSolver(double * ce, double *roots)
//cubic equation solver
// x^3 + ce[0] x^2 + ce[1] x + ce[2] = 0
{
    // depressed cubic, Tschirnhaus transformation, x= t - b/(3a)
    // t^3 + p t +q =0
    unsigned int ret=0;
    double shift=(1./3)*ce[0];
    double p=ce[1] -shift*ce[0];
    double q=ce[0]*( (2./27)*ce[0]*ce[0]-(1./3)*ce[1])+ce[2];
    //Cardano's method,
    //	t=u+v
    //	u^3 + v^3 + ( 3 uv + p ) (u+v) + q =0
    //	select 3uv + p =0, then,
    //	u^3 + v^3 = -q
    //	u^3 v^3 = - p^3/27
    //	so, u^3 and v^3 are roots of equation,
    //	z^2 + q z - p^3/27 = 0
    //	and u^3,v^3 are,
    //		-q/2 \pm sqrt(q^2/4 + p^3/27)
    //	discriminant= q^2/4 + p^3/27
    std::cout<<"cubicSolver:: p="<<p<<"\tq="<<q<<std::endl;
    double discriminant= (1./27)*p*p*p+(1./4)*q*q;
    if ( fabs(p)< 1.0e-75) {
        ret=1;
        *roots=(q>0)?-pow(q,(1./3)):pow(-q,(1./3));
        *roots -= shift;
        return ret;
    }
    std::cout<<"cubicSolver:: discriminant="<<discriminant<<std::endl;
    if(discriminant>0) {
        double ce2[2]= {q, -1./27*p*p*p},u3[2];
        ret=quadraticSolver(ce2,u3);
        if (! ret ) { //should not happen
            std::cerr<<"cubicSolver::Error cubicSolver("<<ce[0]<<' '<<ce[1]<<' '<<ce[2]<<")\n";
        }
        ret=1;
        double u,v;
        u= (q<=0) ? pow(u3[0], 1./3): -pow(-u3[1],1./3);
        //u=(q<=0)?pow(-0.5*q+sqrt(discriminant),1./3):-pow(0.5*q+sqrt(discriminant),1./3);
        v=(-1./3)*p/u;
        std::cout<<"cubicSolver:: u="<<u<<"\tv="<<v<<std::endl;
        std::cout<<"cubicSolver:: u^3="<<u*u*u<<"\tv^3="<<v*v*v<<std::endl;
        *roots=u+v - shift;
        return ret;
    }
    ret=3;
    std::complex<double> u(q,0),rt[3];
    u=pow(-0.5*u-sqrt(0.25*u*u+p*p*p/27),1./3);
    rt[0]=u-p/(3.*u)-shift;
    std::complex<double> w(-0.5,sqrt(3.)/2);
    rt[1]=u*w-p/(3.*u*w)-shift;
    rt[2]=u/w-p*w/(3.*u)-shift;
//	std::cout<<"Roots:\n";
//	std::cout<<rt[0]<<std::endl;
//	std::cout<<rt[1]<<std::endl;
//	std::cout<<rt[2]<<std::endl;

    roots[0]=rt[0].real();
    roots[1]=rt[1].real();
    roots[2]=rt[2].real();
    return ret;
}